

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

undefined8 __thiscall
HPresolve::getDualsForcingRow_abi_cxx11_
          (HPresolve *this,int row,vector<int,_std::allocator<int>_> *fRjs)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  reference pvVar5;
  vector<int,_std::allocator<int>_> *in_RCX;
  int in_EDX;
  long in_RSI;
  undefined8 in_RDI;
  double dVar6;
  int k;
  size_t jj_1;
  double colUpp;
  double colLow;
  vector<double,_std::allocator<double>_> v;
  pair<int,_std::vector<double,_std::allocator<double>_>_> p;
  size_t jj;
  double sum;
  double cost;
  double up;
  double lo;
  KktChStep *in_stack_000001b0;
  int j;
  stringstream ss;
  double z;
  pair<int,_std::vector<double,_std::allocator<double>_>_> *in_stack_fffffffffffffc98;
  pair<int,_std::vector<double,_std::allocator<double>_>_> *in_stack_fffffffffffffca0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffce8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcf0;
  double dVar7;
  double in_stack_fffffffffffffcf8;
  double in_stack_fffffffffffffd00;
  double *in_stack_fffffffffffffd08;
  double *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  int iVar8;
  int local_244;
  ulong local_240;
  vector<double,_std::allocator<double>_> local_228 [3];
  ulong local_1e0;
  double local_1d8;
  value_type local_1d0;
  double local_1c8;
  double local_1c0;
  value_type local_1b4;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  double local_28;
  vector<int,_std::allocator<int>_> *local_20;
  int local_14;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1c0 = -1e+200;
  local_1c8 = 1e+200;
  for (local_1e0 = 0; uVar1 = local_1e0,
      sVar2 = std::vector<int,_std::allocator<int>_>::size(local_20), uVar1 < sVar2;
      local_1e0 = local_1e0 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,local_1e0);
    local_1b4 = *pvVar3;
    std::
    stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::top((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
           *)0x1abe57);
    std::pair<int,_std::vector<double,_std::allocator<double>_>_>::pair
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    std::get<1ul,int,std::vector<double,std::allocator<double>>>
              ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1abe85);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    std::
    stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::pop((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
           *)0x1abeab);
    std::vector<double,_std::allocator<double>_>::operator[](local_228,0);
    std::vector<double,_std::allocator<double>_>::operator[](local_228,1);
    getBoundOnLByZj((HPresolve *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                    (int)((ulong)in_stack_fffffffffffffd18 >> 0x20),(int)in_stack_fffffffffffffd18,
                    in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                    in_stack_fffffffffffffcf8);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffcb0);
    std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
              ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1abf4b);
  }
  if (local_1c8 < local_1c0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"PR: Error in postsolving forcing row ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
    std::operator<<(poVar4," : inconsistent bounds for it\'s dual value.\n");
  }
  dVar7 = local_1c0;
  dVar6 = local_1c8;
  if ((0.0 < local_1c0) || (local_1c8 < 0.0)) {
    if (local_1c0 <= 0.0) {
      if (local_1c8 < 0.0) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98);
        *pvVar5 = dVar6;
      }
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                          (size_type)in_stack_fffffffffffffc98);
      *pvVar5 = dVar7;
    }
  }
  else {
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                        (size_type)in_stack_fffffffffffffc98);
    *pvVar5 = 0.0;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                      (size_type)in_stack_fffffffffffffc98);
  *pvVar3 = 1;
  for (local_240 = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(local_20),
      local_240 < sVar2; local_240 = local_240 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_20,local_240);
    local_1b4 = *pvVar3;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                        (size_type)in_stack_fffffffffffffc98);
    local_1d0 = *pvVar5;
    local_1d8 = 0.0;
    pvVar3 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                        (size_type)in_stack_fffffffffffffc98);
    local_244 = *pvVar3;
    while (iVar8 = local_244,
          pvVar3 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                              (size_type)in_stack_fffffffffffffc98), iVar8 < *pvVar3) {
      std::vector<int,_std::allocator<int>_>::at
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                 (size_type)in_stack_fffffffffffffc98);
      pvVar3 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                          (size_type)in_stack_fffffffffffffc98);
      if (*pvVar3 != 0) {
        dVar7 = local_1d8;
        std::vector<int,_std::allocator<int>_>::at
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                   (size_type)in_stack_fffffffffffffc98);
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98);
        dVar6 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98);
        local_1d8 = dVar6 * *pvVar5 + dVar7;
      }
      local_244 = local_244 + 1;
    }
    dVar6 = local_1d0 + local_1d8;
    local_28 = dVar6;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                        (size_type)in_stack_fffffffffffffc98);
    *pvVar5 = dVar6;
    if (*(int *)(in_RSI + 0x7cc) == 1) {
      std::ostream::operator<<(local_1a0,local_1b4);
      std::operator<<(local_1a0," ");
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                          (size_type)in_stack_fffffffffffffc98);
      in_stack_fffffffffffffca0 =
           (pair<int,_std::vector<double,_std::allocator<double>_>_> *)*pvVar5;
      std::vector<double,_std::allocator<double>_>::at
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                 (size_type)in_stack_fffffffffffffc98);
      KktChStep::addChange(in_stack_000001b0,lo._4_4_,lo._0_4_,up._4_4_,cost,sum,(double)jj);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return in_RDI;
}

Assistant:

string HPresolve::getDualsForcingRow( int row, vector<int>& fRjs) {
	double z;
	stringstream ss;
	int j;

	double lo = -HSOL_CONST_INF;
	double up = HSOL_CONST_INF;

	double cost, sum;

	for (size_t jj=0;jj<fRjs.size();++jj) {
			j = fRjs[jj];

			pair<int, vector<double> > p = oldBounds.top();
			vector<double> v = get<1>(p);
			oldBounds.pop();
			double colLow = v[0];
			double colUpp = v[1];


			//calculate bound x imposed by zj
			getBoundOnLByZj(row, j, &lo, &up, colLow, colUpp);
		}

	//calculate yi
	if (lo>up)
		cout<<"PR: Error in postsolving forcing row "<<row <<" : inconsistent bounds for it's dual value.\n";

	if (lo<=0 && up>=0) {
		valueRowDual.at(row) = 0;
	}
	else if (lo>0) {
		valueRowDual.at(row) = lo;
	}
	else if (up<0) {
		valueRowDual.at(row) = up;
	}

	flagRow.at(row) = 1;


	for (size_t jj=0;jj<fRjs.size();++jj) {
			j = fRjs[jj];
			cost = valueColDual.at(j);
			sum = 0;
			for (int k=Astart.at(j); k<Aend.at(j);++k )
				if (flagRow.at(Aindex.at(k))) {
					sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);
					//cout<<" row "<<Aindex.at(k)<<" dual "<<valueRowDual.at(Aindex.at(k))<<" a_"<<Aindex.at(k)<<"_"<<j<<"\n";
				}
			z = cost + sum;

			valueColDual.at(j) = z;

			if (iKKTcheck == 1) {
				ss<<j;
				ss<<" ";
				chk.addChange(2, 0, j, valuePrimal.at(j), valueColDual.at(j), cost);
			}
		}

	return ss.str();
}